

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.hpp
# Opt level: O1

void __thiscall FileAndMemReader::openFile(FileAndMemReader *this,char *path)

{
  char *pcVar1;
  FILE *pFVar2;
  
  if ((FILE *)this->m_fp != (FILE *)0x0) {
    fclose((FILE *)this->m_fp);
    this->m_fp = (FILE *)0x0;
    this->m_mp = (void *)0x0;
    this->m_mp_size = 0;
    this->m_mp_tell = 0;
  }
  pFVar2 = fopen(path,"rb");
  this->m_fp = (FILE *)pFVar2;
  pcVar1 = (char *)(this->m_file_name)._M_string_length;
  strlen(path);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)path);
  this->m_mp = (void *)0x0;
  this->m_mp_size = 0;
  this->m_mp_tell = 0;
  return;
}

Assistant:

void openFile(const char *path)
    {
        if(m_fp)
            this->close();//Close previously opened file first!
#if !defined(_WIN32) || defined(__WATCOMC__)
        m_fp = std::fopen(path, "rb");
#else
        wchar_t widePath[MAX_PATH];
        int size = MultiByteToWideChar(CP_UTF8, 0, path, static_cast<int>(std::strlen(path)), widePath, MAX_PATH);
        widePath[size] = '\0';
        m_fp = _wfopen(widePath, L"rb");
#endif
        m_file_name = path;
        m_mp = NULL;
        m_mp_size = 0;
        m_mp_tell = 0;
    }